

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void newProcess(void)

{
  Process *pPVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  reference ppMVar5;
  value_type local_a8;
  Process *process_1;
  MemBlock *used;
  MemBlock *free;
  Process *process;
  MemBlock *i;
  iterator __end1;
  iterator __begin1;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> *__range1;
  MemBlock *bestFit;
  char *local_58;
  char *p;
  char local_48 [4];
  int mem;
  char name [50];
  
  memset(local_48,0,0x32);
  p._4_4_ = 0;
  local_58 = strtok((char *)0x0," ");
  if (local_58 == (char *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"have no enough args");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    strcpy(local_48,local_58);
    local_58 = strtok((char *)0x0," ");
    if (local_58 == (char *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"have no enough args");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      __isoc99_sscanf(local_58,"%d",(long)&p + 4);
      std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::sort<newProcess()::__0>
                ((list<MemBlock*,std::allocator<MemBlock*>> *)&freeMemBlockList_abi_cxx11_);
      __range1 = (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)0x0;
      __end1 = std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::begin
                         (&freeMemBlockList_abi_cxx11_);
      i = (MemBlock *)
          std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::end
                    (&freeMemBlockList_abi_cxx11_);
      while (bVar2 = std::operator!=(&__end1,(_Self *)&i), pPVar1 = (Process *)__range1, bVar2) {
        ppMVar5 = std::_List_iterator<MemBlock_*>::operator*(&__end1);
        process = (Process *)*ppMVar5;
        pPVar1 = process;
        if (p._4_4_ <= *(int *)process->name) break;
        std::_List_iterator<MemBlock_*>::operator++(&__end1);
      }
      __range1 = (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)pPVar1;
      if (__range1 == (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)0x0) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "can\'t create new process, reason: no enough mem");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else if (p._4_4_ ==
               *(int *)((long)&(__range1->super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>)
                               ._M_impl._M_node.super__List_node_base._M_next + 4)) {
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::remove
                  (&freeMemBlockList_abi_cxx11_,(char *)&__range1);
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back
                  (&usedMemBlockList_abi_cxx11_,(value_type *)&__range1);
        free = (MemBlock *)operator_new(0x40);
        iVar3 = getNewPid();
        free->start = iVar3;
        strcpy((char *)&free->length,local_48);
        free[7] = (MemBlock)__range1;
        std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::push_back
                  (&processList_abi_cxx11_,(value_type *)&free);
      }
      else {
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::remove
                  (&freeMemBlockList_abi_cxx11_,(char *)&__range1);
        used = (MemBlock *)operator_new(8);
        process_1 = (Process *)operator_new(8);
        process_1->pid =
             *(int *)&(__range1->super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>)._M_impl.
                      _M_node.super__List_node_base._M_next;
        *(int *)process_1->name = p._4_4_;
        used->start = process_1->pid + *(int *)process_1->name;
        used->length = (*(int *)&(__range1->
                                 super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>)._M_impl.
                                 _M_node.super__List_node_base._M_next +
                       *(int *)((long)&(__range1->
                                       super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>).
                                       _M_impl._M_node.super__List_node_base._M_next + 4)) -
                       used->start;
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back
                  (&freeMemBlockList_abi_cxx11_,&used);
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back
                  (&usedMemBlockList_abi_cxx11_,(value_type *)&process_1);
        if (__range1 != (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)0x0) {
          operator_delete(__range1);
        }
        local_a8 = (value_type)operator_new(0x40);
        iVar3 = getNewPid();
        local_a8->pid = iVar3;
        strcpy(local_a8->name,local_48);
        local_a8->memBlock = (MemBlock *)process_1;
        std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::push_back
                  (&processList_abi_cxx11_,&local_a8);
      }
    }
  }
  return;
}

Assistant:

void newProcess() {
    // 获取参数
    char name[50];
    memset(name, 0, 50);
    int mem = 0;
    char *p;
    p = strtok(NULL, " ");
    if (!p) {
        cout << "have no enough args" << endl;
        return;
    }
    strcpy(name, p);
    p = strtok(NULL, " ");
    if (!p) {
        cout << "have no enough args" << endl;
        return;
    }
    sscanf(p, "%d", &mem);

    // 将所有的空闲内存按照从小到大的顺序排序
    freeMemBlockList.sort([=](MemBlock *a, MemBlock *b) -> bool {
        return a->length < b->length;
    });

    // 寻找一块最合适的内存
    MemBlock *bestFit = nullptr;
    for (MemBlock *i : freeMemBlockList)
        if (mem <= i->length) {
            bestFit = i;
            break;
        }
    if (bestFit) {
        // 如果这一块内存刚好跟目标大小一样大
        if (mem == bestFit->length) {
            // 从空闲区域移出原来的元素
            freeMemBlockList.remove(bestFit);
            // 将之添加到已经使用区域
            usedMemBlockList.push_back(bestFit);
            // 创建一个新的进程描述d
            Process *process = new Process;
            process->pid = getNewPid();
            strcpy(process->name, name);
            process->memBlock = bestFit;
            // 将进程描述添加到进程表中
            processList.push_back(process);
            // 否则
        } else {
            // 从空闲区移出原来的元素
            freeMemBlockList.remove(bestFit);
            // 将之划分成两份
            MemBlock *free = new MemBlock;
            MemBlock *used = new MemBlock;
            used->start = bestFit->start;
            used->length = mem;
            free->start = used->start + used->length;
            free->length = bestFit->start + bestFit->length - free->start;
            // 将两份分别添加到对应区域
            freeMemBlockList.push_back(free);
            usedMemBlockList.push_back(used);
            // 删除原来的内存块
            delete bestFit;
            // 创建一个新的进程描述
            Process *process = new Process;
            process->pid = getNewPid();
            strcpy(process->name, name);
            process->memBlock = used;
            // 将进程描述添加到进程表中
            processList.push_back(process);
        }
    } else {
        cout << "can't create new process, reason: no enough mem" << endl;
    }
}